

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngrams_raw.c
# Opt level: O1

ngram_raw_t **
ngrams_raw_read_arpa(lineiter_t **li,logmath_t *lmath,uint32 *counts,int order,hash_table_t *wid)

{
  char *__s1;
  int iVar1;
  uint uVar2;
  ngram_raw_t **raw_ngrams;
  lineiter_t *plVar3;
  ngram_raw_t *pnVar4;
  uint32 *puVar5;
  uint uVar6;
  ulong uVar7;
  uint uVar8;
  uint32 *val;
  ulong n_elem;
  undefined8 *puVar9;
  float fVar10;
  float32 fVar11;
  double dVar12;
  int words_expected;
  char expected_header [20];
  char *wptr [6];
  char local_88 [32];
  char *local_68;
  undefined8 local_60 [6];
  
  raw_ngrams = (ngram_raw_t **)
               __ckd_calloc__((long)(order + -1),8,
                              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/ngrams_raw.c"
                              ,0xae);
  if (1 < order) {
    n_elem = 2;
    while( true ) {
      sprintf(local_88,"\\%d-grams:",n_elem & 0xffffffff);
      plVar3 = *li;
      while( true ) {
        if (plVar3 == (lineiter_t *)0x0) goto LAB_001108f5;
        iVar1 = strcmp(plVar3->buf,local_88);
        if (iVar1 == 0) break;
        plVar3 = lineiter_next(plVar3);
        *li = plVar3;
      }
      if (plVar3 == (lineiter_t *)0x0) break;
      pnVar4 = (ngram_raw_t *)
               __ckd_calloc__((ulong)counts[n_elem - 1],0x18,
                              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/ngrams_raw.c"
                              ,0x94);
      raw_ngrams[n_elem - 2] = pnVar4;
      if (counts[n_elem - 1] == 0) {
        uVar6 = 0;
      }
      else {
        uVar7 = 0;
        uVar8 = 0;
        do {
          uVar6 = (uint)uVar7;
          if (*li == (lineiter_t *)0x0) break;
          plVar3 = lineiter_next(*li);
          *li = plVar3;
          if (plVar3 == (lineiter_t *)0x0) {
            err_msg(ERR_ERROR,
                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/ngrams_raw.c"
                    ,0x99,"Unexpected end of ARPA file. Failed to read %d-gram\n",
                    n_elem & 0xffffffff);
            goto LAB_00110942;
          }
          pnVar4 = raw_ngrams[n_elem - 2] + uVar7;
          uVar2 = str2words(plVar3->buf,&local_68,6);
          if ((long)n_elem < (long)(int)uVar2) {
            pnVar4->order = (uint32)n_elem;
            dVar12 = atof_c(local_68);
            fVar10 = (float)dVar12;
            if (n_elem == (uint)order) {
              pnVar4->prob = (float32)fVar10;
              if (0.0 < fVar10) {
                err_msg(ERR_WARN,
                        "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/ngrams_raw.c"
                        ,0x5d,"%d-gram \'%s\' has positive probability\n",n_elem & 0xffffffff,
                        local_60[0]);
                pnVar4->prob = 0.0;
              }
              fVar10 = logmath_log10_to_log_float(lmath,(float64)(double)(float)pnVar4->prob);
              pnVar4->prob = (float32)fVar10;
            }
            else {
              if (fVar10 <= 0.0) {
                fVar11 = (float32)logmath_log10_to_log_float(lmath,(float64)(double)fVar10);
              }
              else {
                err_msg(ERR_WARN,
                        "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/ngrams_raw.c"
                        ,0x68,"%d-gram \'%s\' has positive probability\n",n_elem,local_60[0]);
                fVar11 = 0.0;
              }
              pnVar4->prob = fVar11;
              if (n_elem + 1 == (ulong)uVar2) {
                pnVar4->backoff = 0.0;
              }
              else {
                dVar12 = atof_c((char *)local_60[n_elem]);
                fVar10 = logmath_log10_to_log_float(lmath,(float64)(double)(float)dVar12);
                pnVar4->backoff = (float32)fVar10;
              }
            }
            puVar5 = (uint32 *)
                     __ckd_calloc__(n_elem,4,
                                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/ngrams_raw.c"
                                    ,0x7a);
            pnVar4->words = puVar5;
            val = puVar5 + (n_elem - 1);
            if (puVar5 <= val) {
              puVar9 = local_60;
              do {
                hash_table_lookup_int32(wid,(char *)*puVar9,(int32 *)val);
                val = val + -1;
                puVar9 = puVar9 + 1;
              } while (pnVar4->words <= val);
            }
          }
          else {
            err_msg(ERR_ERROR,
                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/ngrams_raw.c"
                    ,0x54,"Format error; %d-gram ignored at line %d\n",n_elem & 0xffffffff,
                    (ulong)(uint)plVar3->lineno);
          }
          uVar6 = uVar6 + ((long)n_elem < (long)(int)uVar2);
          uVar7 = (ulong)uVar6;
          uVar8 = uVar8 + 1;
        } while (uVar8 < counts[n_elem - 1]);
      }
      counts[n_elem - 1] = uVar6;
      qsort(raw_ngrams[n_elem - 2],(ulong)uVar6,0x18,ngram_ord_comparator);
      n_elem = n_elem + 1;
      if (n_elem == order + 1) goto LAB_00110942;
    }
LAB_001108f5:
    err_msg(ERR_ERROR,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/ngrams_raw.c"
            ,0x90,"Failed to find \'%s\', language model file truncated\n",local_88);
  }
LAB_00110942:
  if (*li == (lineiter_t *)0x0) {
    err_msg(ERR_ERROR,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/ngrams_raw.c"
            ,0xb8,"ARPA file ends without end-mark\n");
    ngrams_raw_free(raw_ngrams,counts,order);
    raw_ngrams = (ngram_raw_t **)0x0;
  }
  else {
    plVar3 = lineiter_next(*li);
    *li = plVar3;
    __s1 = plVar3->buf;
    iVar1 = strcmp(__s1,"\\end\\");
    if (iVar1 != 0) {
      err_msg(ERR_WARN,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/ngrams_raw.c"
              ,0xc0,"Finished reading ARPA file. Expecting end mark but found \'%s\'\n",__s1);
    }
  }
  return raw_ngrams;
}

Assistant:

ngram_raw_t **
ngrams_raw_read_arpa(lineiter_t ** li, logmath_t * lmath, uint32 * counts,
                     int order, hash_table_t * wid)
{
    ngram_raw_t **raw_ngrams;
    int order_it;

    raw_ngrams =
        (ngram_raw_t **) ckd_calloc(order - 1, sizeof(*raw_ngrams));

    for (order_it = 2; order_it <= order; order_it++) {
        if (ngrams_raw_read_section(&raw_ngrams[order_it - 2], li, wid, lmath,
                              counts + order_it - 1, order_it, order) < 0)
        break;
    }

    /* Check if we found ARPA end-mark */
    if (*li == NULL) {
        E_ERROR("ARPA file ends without end-mark\n");
	ngrams_raw_free(raw_ngrams, counts, order);
        return NULL;
    } else {
        *li = lineiter_next(*li);
	if (strcmp((*li)->buf, "\\end\\") != 0) {
    	    E_WARN
        	("Finished reading ARPA file. Expecting end mark but found '%s'\n",
        	 (*li)->buf);
        }
    }

    return raw_ngrams;
}